

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  ulong *puVar1;
  ulong uVar2;
  unsigned_long uVar3;
  pointer puVar4;
  ulong uVar5;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  _Var6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>,___gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>_>
  pVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  int rank;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  long local_60;
  value_type_conflict1 local_58;
  ulong local_50;
  long *local_48;
  long local_40;
  ulong local_38;
  
  local_68 = __return_storage_ptr__;
  local_60 = begin;
  local_48 = end;
  if ((end[1] - *end >> 3) * -0x5555555555555555 - ((long)*(int *)(param_5 + 0x10) + -1) != 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0xe9,"split","splitters.size() == (size_t)comm.size() - 1");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_58 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_68,(long)*(int *)(param_5 + 0x10),&local_58,&local_69);
  local_50 = (local_60 - (long)this >> 3) * -0x5555555555555555;
  lVar11 = *local_48;
  local_40 = param_5;
  if (local_48[1] - lVar11 != 0) {
    uVar9 = (local_48[1] - lVar11 >> 3) * -0x5555555555555555;
    local_38 = (ulong)*(int *)(param_5 + 0x10);
    _Var6._M_current = (TwoBSA<unsigned_long> *)this;
    uVar5 = 0;
    do {
      puVar1 = (ulong *)(lVar11 + uVar5 * 0x18);
      uVar12 = uVar5 + 1;
      uVar13 = 1;
      if (uVar12 < uVar9) {
        uVar10 = *puVar1;
        uVar14 = 1;
        do {
          uVar13 = (uint)uVar14;
          uVar14 = *(ulong *)(lVar11 + uVar12 * 0x18);
          if ((uVar10 < uVar14) ||
             ((uVar10 == uVar14 && (puVar1[1] < *(ulong *)(lVar11 + uVar12 * 0x18 + 8))))) break;
          uVar13 = uVar13 + 1;
          uVar14 = (ulong)uVar13;
          uVar12 = uVar14 + uVar5;
        } while (uVar12 < uVar9);
      }
      pVar15 = std::
               __equal_range<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,TwoBSA<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<TwoBSA<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                         (_Var6._M_current,local_60);
      this = (impl *)pVar15.second._M_current;
      puVar4 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar3 = ((long)pVar15.first._M_current._M_current - (long)_Var6._M_current >> 3) *
              -0x5555555555555555 + puVar4[uVar5];
      puVar4[uVar5] = uVar3;
      uVar9 = ((long)this - (long)pVar15.first._M_current >> 3) * -0x5555555555555555;
      if (uVar13 != 0) {
        uVar10 = (uVar3 + uVar9) / (ulong)(uVar13 + 1) + 1;
        lVar11 = uVar5 << 0x20;
        uVar14 = 0;
        do {
          uVar2 = puVar4[uVar5 + uVar14];
          uVar7 = local_50 / local_38 + (ulong)((ulong)(lVar11 >> 0x20) < local_50 % local_38);
          uVar8 = uVar7 - uVar2;
          if (uVar7 < uVar2 || uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            if (uVar8 <= uVar10) {
              uVar8 = uVar10;
            }
            if (uVar9 < uVar8) {
              uVar8 = uVar9;
            }
            uVar9 = uVar9 - uVar8;
          }
          puVar4[uVar5 + uVar14] = uVar8 + uVar2;
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x100000000;
        } while (uVar13 != uVar14);
      }
      puVar4[uVar12] = puVar4[uVar12] + uVar9;
      lVar11 = *local_48;
      uVar9 = (local_48[1] - lVar11 >> 3) * -0x5555555555555555;
      _Var6._M_current = (TwoBSA<unsigned_long> *)this;
      uVar5 = uVar12;
    } while (uVar12 < uVar9);
  }
  puVar4 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4[(long)*(int *)(local_40 + 0x10) + -1] =
       puVar4[(long)*(int *)(local_40 + 0x10) + -1] +
       (local_60 - (long)this >> 3) * -0x5555555555555555;
  uVar5 = 0;
  for (; puVar4 != (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    uVar5 = uVar5 + *puVar4;
  }
  if (uVar5 != local_50) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0x114,"split",
           "std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  return local_68;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}